

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::SyncToSetAndBackupInst<true>::Print
          (SyncToSetAndBackupInst<true> *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015bc47d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x31);
  }
  DebugWriter::Print(w,L"SyncToNegatedSetAndBackup");
  DebugWriter::Print(w,L"(");
  SetMixin<true>::Print(&this->super_SetMixin<true>,w,litbuf);
  DebugWriter::Print(w,L", ");
  DebugWriter::Print(w,L"backup: ");
  CountDomain::Print(&(this->super_BackupMixin).backup,w);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015bc47d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<true>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<true>,L"SetMixin<true>");
    Inst::PrintBytes<UnifiedRegex::BackupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BackupMixin,L"BackupMixin");
    DebugWriter::Unindent(w);
  }
  return 0x31;
}

Assistant:

int SyncToSetAndBackupInst<IsNegation>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (IsNegation)
        {
            PRINT_RE_BYTECODE_BEGIN("SyncToNegatedSetAndBackup");
            PRINT_MIXIN_COMMA(SetMixin<true>);
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("SyncToSetAndBackup");
            PRINT_MIXIN_COMMA(SetMixin<false>);
        }

        PRINT_MIXIN(BackupMixin);
        PRINT_RE_BYTECODE_MID();
        IsNegation ? PRINT_BYTES(SetMixin<true>) : PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(BackupMixin);
        PRINT_RE_BYTECODE_END();
    }